

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_each.cpp
# Opt level: O0

void __thiscall tst_helpers_each::preserveValues(tst_helpers_each *this)

{
  initializer_list<int> args;
  initializer_list<int> args_00;
  initializer_list<int> args_01;
  bool bVar1;
  int local_124 [3];
  iterator local_118;
  undefined8 local_110;
  QList<int> local_108;
  undefined4 local_f0;
  int local_ec [3];
  iterator local_e0;
  undefined8 local_d8;
  QList<int> local_d0;
  QList<int> local_b8;
  QList<int> local_a0;
  anon_class_8_1_70098e60_for_fn local_88 [3];
  int local_6c [3];
  iterator local_60;
  undefined8 local_58;
  QList<int> local_50;
  undefined1 local_38 [8];
  QPromise<QList<int>_> p;
  QVector<int> values;
  tst_helpers_each *this_local;
  
  QList<int>::QList((QList<int> *)&p.super_QPromiseBase<QList<int>_>.m_d);
  local_6c[0] = 0x2a;
  local_6c[1] = 0x2b;
  local_6c[2] = 0x2c;
  local_60 = local_6c;
  local_58 = 3;
  args_01._M_len = 3;
  args_01._M_array = local_60;
  QList<int>::QList(&local_50,args_01);
  local_88[0].values = (QVector<int> *)&p.super_QPromiseBase<QList<int>_>.m_d;
  QtPromise::each<QList<int>,tst_helpers_each::preserveValues()::__0>
            ((QtPromise *)local_38,&local_50,local_88);
  QList<int>::~QList(&local_50);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (int *)0x0;
  local_b8.d.size = 0;
  QList<int>::QList(&local_b8);
  waitForValue<QList<int>>(&local_a0,(QPromise<QList<int>_> *)local_38,&local_b8);
  local_ec[0] = 0x2a;
  local_ec[1] = 0x2b;
  local_ec[2] = 0x2c;
  local_e0 = local_ec;
  local_d8 = 3;
  args_00._M_len = 3;
  args_00._M_array = local_e0;
  QList<int>::QList(&local_d0,args_00);
  bVar1 = QTest::qCompare<int>
                    (&local_a0,&local_d0,"waitForValue(p, QVector<int>{})",
                     "(QVector<int>{42, 43, 44})",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp"
                     ,0x47);
  QList<int>::~QList(&local_d0);
  QList<int>::~QList(&local_a0);
  QList<int>::~QList(&local_b8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_124[0] = 0x2b;
    local_124[1] = 0x2c;
    local_124[2] = 0x2d;
    local_118 = local_124;
    local_110 = 3;
    args._M_len = 3;
    args._M_array = local_118;
    QList<int>::QList(&local_108,args);
    bVar1 = QTest::qCompare<int>
                      ((QList<int> *)&p.super_QPromiseBase<QList<int>_>.m_d,&local_108,"values",
                       "(QVector<int>{43, 44, 45})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp"
                       ,0x48);
    QList<int>::~QList(&local_108);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_f0 = 0;
    }
    else {
      local_f0 = 1;
    }
  }
  else {
    local_f0 = 1;
  }
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_38);
  QList<int>::~QList((QList<int> *)&p.super_QPromiseBase<QList<int>_>.m_d);
  return;
}

Assistant:

void tst_helpers_each::preserveValues()
{
    QVector<int> values;
    auto p = QtPromise::each(QVector<int>{42, 43, 44}, [&](int v, ...) {
        values << v + 1;
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(values, (QVector<int>{43, 44, 45}));
}